

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

void __thiscall
ft::list<int,ft::allocator<int>>::merge<ft::less<int>>
          (list<int,ft::allocator<int>> *this,Node *x,undefined8 param_3,undefined8 param_4,
          __off64_t *param_5,size_t param_6)

{
  Node *__offin;
  bool bVar1;
  reference x_00;
  reference y;
  uint in_stack_ffffffffffffff48;
  bool local_92;
  undefined1 local_88 [39];
  byte local_61;
  undefined1 local_60 [16];
  list<int,_ft::allocator<int>_> local_50;
  undefined1 local_30 [8];
  iterator it;
  list<int,_ft::allocator<int>_> *x_local;
  list<int,_ft::allocator<int>_> *this_local;
  
  if ((Node *)this != x) {
    it.m_node = x;
    list<int,_ft::allocator<int>_>::begin((list<int,_ft::allocator<int>_> *)local_30);
    while (bVar1 = list<int,_ft::allocator<int>_>::empty
                             ((list<int,_ft::allocator<int>_> *)it.m_node),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      local_61 = 0;
      list<int,_ft::allocator<int>_>::end((list<int,_ft::allocator<int>_> *)(local_60 + 0x10));
      bVar1 = operator==((listIterator<int> *)local_30,(listIterator<int> *)(local_60 + 0x10));
      local_92 = true;
      if (!bVar1) {
        list<int,_ft::allocator<int>_>::begin((list<int,_ft::allocator<int>_> *)local_60);
        local_61 = 1;
        x_00 = listIterator<int>::operator*((listIterator<int> *)local_60);
        y = listIterator<int>::operator*((listIterator<int> *)local_30);
        local_92 = less<int>::operator()((less<int> *)((long)&this_local + 7),x_00,y);
      }
      if ((local_61 & 1) != 0) {
        listIterator<int>::~listIterator((listIterator<int> *)local_60);
      }
      listIterator<int>::~listIterator((listIterator<int> *)(local_60 + 0x10));
      if (local_92 == false) {
        listIterator<int>::operator++((listIterator<int> *)local_30);
      }
      else {
        listIterator<int>::listIterator
                  ((listIterator<int> *)(local_88 + 0x10),(listIterator<int> *)local_30);
        __offin = it.m_node;
        list<int,_ft::allocator<int>_>::begin((list<int,_ft::allocator<int>_> *)local_88);
        list<int,_ft::allocator<int>_>::splice
                  ((list<int,_ft::allocator<int>_> *)this,(int)local_88 + 0x10,(__off64_t *)__offin,
                   (int)local_88,param_5,param_6,in_stack_ffffffffffffff48);
        listIterator<int>::~listIterator((listIterator<int> *)local_88);
        listIterator<int>::~listIterator((listIterator<int> *)(local_88 + 0x10));
      }
    }
    listIterator<int>::~listIterator((listIterator<int> *)local_30);
  }
  return;
}

Assistant:

void merge(list & x, Compare comp) {
		if (this != &x) {
			iterator	it = this->begin();
			while (!x.empty()) {
				if (it == this->end() || comp(*(x.begin()), *it)) this->splice(it, x, x.begin());
				else ++it;
			}
		}
	}